

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QList<QLocale> *
QLocale::matchingLocales
          (QList<QLocale> *__return_storage_ptr__,Language language,Script script,
          Territory territory)

{
  Language LVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  bool bVar4;
  undefined **dd;
  QLocaleId other;
  QLocaleId other_00;
  ulong uVar5;
  long in_FS_OFFSET;
  initializer_list<QLocale> args;
  QLocaleId local_46;
  QLocale local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_46.language_id = language;
  local_46.script_id = script;
  local_46.territory_id = territory;
  if ((HanifiScript < script || LastLanguage < language) || LastCountry < territory) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QLocale *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_002dd00f;
  }
  if (language == C) {
    QLocale(&local_40,C,AnyScript,AnyCountry);
    args._M_len = 1;
    args._M_array = &local_40;
    QList<QLocale>::QList(__return_storage_ptr__,args);
LAB_002dcdf8:
    ~QLocale(&local_40);
  }
  else {
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QLocale *)0x0;
    if ((script == AnyScript && language == AnyLanguage) && territory == AnyCountry) {
      QList<QLocale>::reserve(__return_storage_ptr__,0x2aa);
    }
    uVar5 = (ulong)locale_index[language];
    while( true ) {
      uVar5 = uVar5 & 0xffff;
      LVar1 = locale_data[uVar5].m_language_id;
      bVar4 = language == LVar1;
      if (language == AnyLanguage) {
        bVar4 = LVar1 != AnyLanguage;
      }
      if (!bVar4) break;
      uVar2 = locale_data[uVar5].m_script_id;
      uVar3 = locale_data[uVar5].m_territory_id;
      other.territory_id = uVar3;
      other.script_id = uVar2;
      other.language_id = LVar1;
      bVar4 = QLocaleId::acceptScriptTerritory(&local_46,other);
      if (bVar4) {
        dd = &c_private()::c_locale;
        if (LVar1 != C) {
          dd = (undefined **)operator_new(0x20);
          ((QLocalePrivate *)dd)->m_data = locale_data + uVar5;
          (((QLocalePrivate *)dd)->ref)._q_value.super___atomic_base<int>._M_i = 0;
          ((QLocalePrivate *)dd)->m_index = uVar5;
          (((QLocalePrivate *)dd)->m_numberOptions).
          super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
          super_QFlagsStorage<QLocale::NumberOption>.i = 0;
        }
        QLocale(&local_40,(QLocalePrivate *)dd);
        QList<QLocale>::emplaceBack<QLocale>(__return_storage_ptr__,&local_40);
        ~QLocale(&local_40);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      language = local_46.language_id;
    }
    systemData((qsizetype *)0x0);
    bVar4 = systemLocaleData.m_language_id != 0;
    if (local_46.language_id != AnyLanguage) {
      bVar4 = local_46.language_id == systemLocaleData.m_language_id;
    }
    if ((bVar4) &&
       (other_00.script_id = systemLocaleData.m_script_id,
       other_00.territory_id = systemLocaleData.m_territory_id,
       other_00.language_id = systemLocaleData.m_language_id,
       bVar4 = QLocaleId::acceptScriptTerritory(&local_46,other_00), bVar4)) {
      system((char *)&local_40);
      QList<QLocale>::emplaceBack<QLocale>(__return_storage_ptr__,&local_40);
      goto LAB_002dcdf8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002dd00f:
  __stack_chk_fail();
}

Assistant:

QList<QLocale> QLocale::matchingLocales(Language language, Script script, Territory territory)
{
    const QLocaleId filter { language, script, territory };
    if (!filter.isValid())
        return QList<QLocale>();

    if (language == C)
        return QList<QLocale>{QLocale(C)};

    QList<QLocale> result;
    if (filter.matchesAll())
        result.reserve(locale_data_size);

    quint16 index = locale_index[language];
    // There may be no matches, for some languages (e.g. Abkhazian at CLDR v39).
    while (filter.acceptLanguage(locale_data[index].m_language_id)) {
        const QLocaleId id = locale_data[index].id();
        if (filter.acceptScriptTerritory(id)) {
            result.append(QLocale(*(id.language_id == C ? c_private()
                                    : new QLocalePrivate(locale_data + index, index))));
        }
        ++index;
    }

    // Add current system locale, if it matches
    const auto syslocaledata = systemData();

    if (filter.acceptLanguage(syslocaledata->m_language_id)) {
        const QLocaleId id = syslocaledata->id();
        if (filter.acceptScriptTerritory(id))
            result.append(system());
    }

    return result;
}